

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

quint64 pseudoClass(State state)

{
  Int IVar1;
  QFlagsStorage<QStyle::StateFlag> QVar2;
  long in_FS_OFFSET;
  quint64 pc;
  undefined8 in_stack_ffffffffffffff98;
  StateFlag other;
  enum_type in_stack_ffffffffffffffa0;
  enum_type in_stack_ffffffffffffffa4;
  ulong uVar3;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_50;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_4c;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_48;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_44;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_40;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_3c;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_38;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_34;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_30;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_2c;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_28;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_24;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_20;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_1c;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_18;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_14;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  other = (StateFlag)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_10.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  if (IVar1 == 0) {
    uVar3 = uVar3 | 2;
  }
  else {
    uVar3 = uVar3 | 1;
    local_14.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
    IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar1 != 0) {
      uVar3 = uVar3 | 0x10;
    }
  }
  local_18.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x80000000;
  }
  local_1c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x1000;
  }
  local_20.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 4;
  }
  local_24.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 8;
  }
  local_28.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x2000000020;
  }
  local_2c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x4000000040;
  }
  local_30.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x80;
  }
  local_34.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x200;
  }
  local_38.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_38);
  if (IVar1 == 0) {
    uVar3 = uVar3 | 0x800;
  }
  else {
    uVar3 = uVar3 | 0x400;
  }
  local_40.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       operator|(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  QVar2.i = (Int)QFlags<QStyle::StateFlag>::operator|
                           ((QFlags<QStyle::StateFlag> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),other);
  local_3c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)CONCAT44(QVar2.i,in_stack_ffffffffffffffa0),
                  (QFlagsStorageHelper<QStyle::StateFlag,_4>)SUB84(uVar3,0));
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
  if (IVar1 == 0) {
    uVar3 = uVar3 | 0x20000000000;
  }
  else {
    uVar3 = uVar3 | 0x40000000000;
  }
  local_44.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)CONCAT44(QVar2.i,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x2000;
  }
  local_48.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)CONCAT44(QVar2.i,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_48);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x4000;
  }
  local_4c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)CONCAT44(QVar2.i,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_4c);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x40000000;
  }
  local_50.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)CONCAT44(QVar2.i,in_stack_ffffffffffffffa0),other);
  IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_50);
  if (IVar1 != 0) {
    uVar3 = uVar3 | 0x10000000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

static quint64 pseudoClass(QStyle::State state)
{
    quint64 pc = 0;
    if (state & QStyle::State_Enabled) {
        pc |= PseudoClass_Enabled;
        if (state & QStyle::State_MouseOver)
            pc |= PseudoClass_Hover;
    } else {
        pc |= PseudoClass_Disabled;
    }
    if (state & QStyle::State_Active)
        pc |= PseudoClass_Active;
    if (state & QStyle::State_Window)
        pc |= PseudoClass_Window;
    if (state & QStyle::State_Sunken)
        pc |= PseudoClass_Pressed;
    if (state & QStyle::State_HasFocus)
        pc |= PseudoClass_Focus;
    if (state & QStyle::State_On)
        pc |= (PseudoClass_On | PseudoClass_Checked);
    if (state & QStyle::State_Off)
        pc |= (PseudoClass_Off | PseudoClass_Unchecked);
    if (state & QStyle::State_NoChange)
        pc |= PseudoClass_Indeterminate;
    if (state & QStyle::State_Selected)
        pc |= PseudoClass_Selected;
    if (state & QStyle::State_Horizontal)
        pc |= PseudoClass_Horizontal;
    else
        pc |= PseudoClass_Vertical;
    if (state & (QStyle::State_Open | QStyle::State_On | QStyle::State_Sunken))
        pc |= PseudoClass_Open;
    else
        pc |= PseudoClass_Closed;
    if (state & QStyle::State_Children)
        pc |= PseudoClass_Children;
    if (state & QStyle::State_Sibling)
        pc |= PseudoClass_Sibling;
    if (state & QStyle::State_ReadOnly)
        pc |= PseudoClass_ReadOnly;
    if (state & QStyle::State_Item)
        pc |= PseudoClass_Item;
#ifdef QT_KEYPAD_NAVIGATION
    if (state & QStyle::State_HasEditFocus)
        pc |= PseudoClass_EditFocus;
#endif
    return pc;
}